

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O0

void __thiscall Console::Prompt::Private::moveCursorPosition(Private *this,usize from,ssize x)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  char *data;
  usize len;
  ulong uVar4;
  undefined1 local_d0 [8];
  String add_1;
  String add;
  undefined1 local_70 [8];
  String moveCmd;
  usize newX;
  usize newY;
  usize oldX;
  usize oldY;
  usize to;
  ssize x_local;
  usize from_local;
  Private *this_local;
  
  if (this->stdoutScreenWidth == 0) {
    __assert_fail("stdoutScreenWidth != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/Console.cpp"
                  ,0x166,"void Console::Prompt::Private::moveCursorPosition(usize, ssize)");
  }
  uVar2 = from / this->stdoutScreenWidth;
  uVar4 = from % this->stdoutScreenWidth;
  uVar3 = (from + x) / this->stdoutScreenWidth;
  moveCmd._data.ref = (from + x) % this->stdoutScreenWidth;
  String::String((String *)local_70);
  oldX._0_4_ = (int)uVar2;
  newX._0_4_ = (int)uVar3;
  if (uVar3 < uVar2) {
    String::printf((String *)local_70,"\x1b[%dA",(ulong)(uint)((int)oldX - (int)newX));
  }
  else if (uVar2 < uVar3) {
    String::printf((String *)local_70,"\x1b[%dB",(ulong)(uint)((int)newX - (int)oldX));
  }
  newY._0_4_ = (int)uVar4;
  if (moveCmd._data.ref < uVar4) {
    String::String((String *)&add_1._data.ref);
    String::printf((String *)&add_1._data.ref,"\x1b[%dD",
                   (ulong)(uint)((int)newY - (int)moveCmd._data.ref));
    String::operator+=((String *)local_70,(String *)&add_1._data.ref);
    String::~String((String *)&add_1._data.ref);
  }
  else if (uVar4 < moveCmd._data.ref) {
    String::String((String *)local_d0);
    String::printf((String *)local_d0,"\x1b[%dC",(ulong)(uint)((int)moveCmd._data.ref - (int)newY));
    String::operator+=((String *)local_70,(String *)local_d0);
    String::~String((String *)local_d0);
  }
  bVar1 = String::isEmpty((String *)local_70);
  if (!bVar1) {
    data = String::operator_cast_to_char_((String *)local_70);
    len = String::length((String *)local_70);
    writeConsole(this,data,len);
  }
  String::~String((String *)local_70);
  return;
}

Assistant:

void moveCursorPosition(usize from, ssize x)
  {
#ifdef _MSC_VER
    usize to = from + x;
    usize oldY = from / stdoutScreenWidth;
    usize newY = to / stdoutScreenWidth;
    usize newX = to % stdoutScreenWidth;
    usize cursorX, cursorY;
    getCursorPosition(cursorX, cursorY);
    COORD pos = {(SHORT)newX, (SHORT)(cursorY + ((ssize)newY - (ssize)oldY))};
    VERIFY(SetConsoleCursorPosition(hOriginalStdOut, pos)); // this resets the caret blink timer
#else
    usize to = from + x;
    assert(stdoutScreenWidth != 0);
    usize oldY = from / stdoutScreenWidth;
    usize oldX = from % stdoutScreenWidth;
    usize newY = to / stdoutScreenWidth;
    usize newX = to % stdoutScreenWidth;
    String moveCmd;
    if(newY < oldY)
      moveCmd.printf("\x1b[%dA", (int)(oldY - newY));
    else if(newY > oldY)
      moveCmd.printf("\x1b[%dB", (int)(newY - oldY));
    if(newX < oldX)
    {
      String add;
      add.printf("\x1b[%dD", (int)(oldX - newX));
      moveCmd += add;
    }
    else if(newX > oldX)
    {
      String add;
      add.printf("\x1b[%dC", (int)(newX - oldX));
      moveCmd += add;
    }
    if(!moveCmd.isEmpty())
      writeConsole(moveCmd, moveCmd.length());
#endif
  }